

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Cast_x86_avx::forward(Cast_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int _d;
  uint _c;
  int iVar2;
  int _elempack;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  unsigned_short uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  void *pvVar11;
  undefined1 (*pauVar12) [16];
  void *pvVar13;
  ulong uVar14;
  long lVar15;
  int i;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  uint uVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  iVar8 = (this->super_Cast).type_from;
  iVar9 = (this->super_Cast).type_to;
  if (iVar8 == iVar9) {
    iVar8 = 0;
    if (top_blob != bottom_blob) {
      piVar3 = bottom_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar3 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar3;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar9 = bottom_blob->w;
      iVar10 = bottom_blob->h;
      iVar1 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar9;
      top_blob->h = iVar10;
      top_blob->d = iVar1;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar10 = bottom_blob->w;
    iVar1 = bottom_blob->h;
    _d = bottom_blob->d;
    _c = bottom_blob->c;
    iVar2 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    sVar17 = (size_t)_elempack;
    switch(iVar9) {
    case 1:
      if (iVar8 == 3) {
        Cast::forward(&this->super_Cast,bottom_blob,top_blob,opt);
      }
      sVar17 = sVar17 * 4;
      break;
    case 2:
    case 4:
      sVar17 = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      sVar17 = bottom_blob->elemsize;
    }
    switch(iVar2) {
    case 1:
      Mat::create(top_blob,iVar10,sVar17,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar10,iVar1,sVar17,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar10,iVar1,_c,sVar17,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar10,iVar1,_d,_c,sVar17,_elempack,opt->blob_allocator);
    }
    iVar8 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if (((this->super_Cast).type_from == 1) && ((this->super_Cast).type_to == 2)) {
        iVar8 = cpu_support_x86_f16c();
        if (iVar8 == 0) {
          iVar8 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
          uVar18 = 0;
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          uVar14 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar14 = uVar18;
          }
          for (; uVar18 != uVar14; uVar18 = uVar18 + 1) {
            sVar17 = bottom_blob->cstep;
            sVar4 = top_blob->cstep;
            sVar5 = bottom_blob->elemsize;
            pvVar11 = bottom_blob->data;
            sVar6 = top_blob->elemsize;
            pvVar13 = top_blob->data;
            for (lVar15 = 0; iVar8 != (int)lVar15; lVar15 = lVar15 + 1) {
              uVar7 = float32_to_float16(*(float *)((long)pvVar11 +
                                                   lVar15 * 4 + sVar17 * sVar5 * uVar18));
              *(unsigned_short *)((long)pvVar13 + lVar15 * 2 + sVar4 * sVar6 * uVar18) = uVar7;
            }
          }
        }
        else {
          cast_fp32_to_fp16_sse_f16c(bottom_blob,top_blob,opt);
        }
      }
      if (((this->super_Cast).type_from == 2) && ((this->super_Cast).type_to == 1)) {
        iVar8 = cpu_support_x86_f16c();
        if (iVar8 == 0) {
          iVar8 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
          uVar18 = 0;
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          uVar14 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar14 = uVar18;
          }
          for (; uVar18 != uVar14; uVar18 = uVar18 + 1) {
            sVar17 = bottom_blob->cstep;
            sVar4 = top_blob->cstep;
            sVar5 = bottom_blob->elemsize;
            pvVar11 = bottom_blob->data;
            sVar6 = top_blob->elemsize;
            pvVar13 = top_blob->data;
            for (lVar15 = 0; iVar8 != (int)lVar15; lVar15 = lVar15 + 1) {
              fVar22 = float16_to_float32(*(unsigned_short *)
                                           ((long)pvVar11 + lVar15 * 2 + sVar17 * sVar5 * uVar18));
              *(float *)((long)pvVar13 + lVar15 * 4 + sVar4 * sVar6 * uVar18) = fVar22;
            }
          }
        }
        else {
          cast_fp16_to_fp32_sse_f16c(bottom_blob,top_blob,opt);
        }
      }
      iVar8 = (this->super_Cast).type_from;
      iVar9 = (this->super_Cast).type_to;
      if (iVar9 == 1 && iVar8 == 3) {
        uVar19 = _d * _elempack * iVar1 * iVar10;
        pvVar11 = bottom_blob->data;
        sVar17 = bottom_blob->cstep;
        pvVar13 = top_blob->data;
        sVar4 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        uVar14 = 0;
        uVar18 = (ulong)uVar19;
        if ((int)uVar19 < 1) {
          uVar18 = uVar14;
        }
        uVar21 = (ulong)_c;
        if ((int)_c < 1) {
          uVar21 = uVar14;
        }
        sVar6 = bottom_blob->elemsize;
        for (; uVar14 != uVar21; uVar14 = uVar14 + 1) {
          for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
            *(float *)((long)pvVar13 + uVar16 * 4) = (float)(int)*(char *)((long)pvVar11 + uVar16);
          }
          pvVar13 = (void *)((long)pvVar13 + sVar4 * sVar5);
          pvVar11 = (void *)((long)pvVar11 + sVar17 * sVar6);
        }
        iVar9 = (this->super_Cast).type_to;
      }
      if ((iVar8 == 1) && (iVar9 == 4)) {
        iVar8 = cpu_support_x86_avx2();
        if (iVar8 == 0) {
          iVar8 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
          uVar14 = 0;
          uVar18 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar18 = uVar14;
          }
          for (; uVar14 != uVar18; uVar14 = uVar14 + 1) {
            pvVar11 = bottom_blob->data;
            sVar17 = bottom_blob->elemsize;
            sVar4 = bottom_blob->cstep;
            pauVar20 = (undefined1 (*) [16])(sVar4 * uVar14 * sVar17 + (long)pvVar11);
            pvVar13 = top_blob->data;
            sVar5 = top_blob->elemsize;
            sVar6 = top_blob->cstep;
            pauVar12 = (undefined1 (*) [16])(sVar6 * uVar14 * sVar5 + (long)pvVar13);
            lVar15 = 0;
            for (iVar9 = 0; iVar9 + 0xf < iVar8; iVar9 = iVar9 + 0x10) {
              auVar23 = vpsrld_avx(*pauVar20,0x10);
              auVar24 = vpsrld_avx(pauVar20[1],0x10);
              auVar23 = vpackusdw_avx(auVar23,auVar24);
              auVar24 = vpsrld_avx(pauVar20[2],0x10);
              auVar25 = vpsrld_avx(pauVar20[3],0x10);
              auVar24 = vpackusdw_avx(auVar24,auVar25);
              pauVar12[1] = auVar24;
              *pauVar12 = auVar23;
              pauVar20 = pauVar20 + 4;
              pauVar12 = pauVar12 + 2;
              lVar15 = lVar15 + 0x10;
            }
            for (; iVar9 + 7 < iVar8; iVar9 = iVar9 + 8) {
              auVar23 = vpsrld_avx(*pauVar20,0x10);
              auVar24 = vpsrld_avx(pauVar20[1],0x10);
              auVar23 = vpackusdw_avx(auVar23,auVar24);
              *pauVar12 = auVar23;
              pauVar20 = pauVar20 + 2;
              pauVar12 = pauVar12 + 1;
              lVar15 = lVar15 + 8;
            }
            for (; (int)lVar15 < iVar8; lVar15 = lVar15 + 1) {
              *(undefined2 *)((long)pvVar13 + lVar15 * 2 + sVar6 * sVar5 * uVar14) =
                   *(undefined2 *)((long)pvVar11 + lVar15 * 4 + sVar4 * sVar17 * uVar14 + 2);
            }
          }
        }
        else {
          cast_fp32_to_bf16_sse_avx2(bottom_blob,top_blob,opt);
        }
      }
      iVar8 = 0;
      if (((this->super_Cast).type_from == 4) && ((this->super_Cast).type_to == 1)) {
        iVar9 = cpu_support_x86_avx2();
        if (iVar9 == 0) {
          iVar9 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
          iVar8 = 0;
          uVar18 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar18 = 0;
          }
          for (uVar14 = 0; uVar14 != uVar18; uVar14 = uVar14 + 1) {
            pvVar11 = bottom_blob->data;
            sVar17 = bottom_blob->elemsize;
            sVar4 = bottom_blob->cstep;
            pauVar20 = (undefined1 (*) [16])(sVar4 * uVar14 * sVar17 + (long)pvVar11);
            pvVar13 = top_blob->data;
            sVar5 = top_blob->elemsize;
            sVar6 = top_blob->cstep;
            pauVar12 = (undefined1 (*) [16])(sVar6 * uVar14 * sVar5 + (long)pvVar13);
            lVar15 = 0;
            for (iVar10 = 0; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
              auVar24 = vpunpcklwd_avx((undefined1  [16])0x0,*pauVar20);
              auVar23 = vpunpckhwd_avx((undefined1  [16])0x0,*pauVar20);
              pauVar12[1] = auVar23;
              *pauVar12 = auVar24;
              pauVar20 = pauVar20 + 1;
              pauVar12 = pauVar12 + 2;
              lVar15 = lVar15 + 8;
            }
            for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
              auVar23._8_8_ = 0;
              auVar23._0_8_ = *(ulong *)*pauVar20;
              auVar23 = vpunpcklwd_avx((undefined1  [16])0x0,auVar23);
              *pauVar12 = auVar23;
              pauVar20 = (undefined1 (*) [16])(*pauVar20 + 8);
              pauVar12 = pauVar12 + 1;
              lVar15 = lVar15 + 4;
            }
            for (; (int)lVar15 < iVar9; lVar15 = lVar15 + 1) {
              *(uint *)((long)pvVar13 + lVar15 * 4 + sVar6 * sVar5 * uVar14) =
                   (uint)*(ushort *)((long)pvVar11 + lVar15 * 2 + sVar4 * sVar17 * uVar14) << 0x10;
            }
          }
        }
        else {
          cast_bf16_to_fp32_sse_avx2(bottom_blob,top_blob,opt);
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int Cast_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}